

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * gl4cts::GLSL420Pack::Utils::getTypeName(TYPES type,GLuint n_columns,GLuint n_rows)

{
  TestError *this;
  GLchar *local_28;
  GLchar *result;
  GLuint n_rows_local;
  GLuint n_columns_local;
  TYPES type_local;
  
  if ((((n_columns == 0) || (n_rows == 0)) || (4 < n_columns)) || (4 < n_rows)) {
    _n_columns_local = (GLchar *)0x0;
  }
  else {
    switch(type) {
    case FLOAT:
      local_28 = getTypeName::float_lut[n_columns - 1][n_rows - 1];
      break;
    case DOUBLE:
      local_28 = getTypeName::double_lut[n_columns - 1][n_rows - 1];
      break;
    case INT:
      local_28 = getTypeName::int_lut[n_rows - 1];
      break;
    case UINT:
      local_28 = getTypeName::uint_lut[n_rows - 1];
      break;
    default:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invliad enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                 ,0x2a5);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    _n_columns_local = local_28;
  }
  return _n_columns_local;
}

Assistant:

const glw::GLchar* Utils::getTypeName(TYPES type, glw::GLuint n_columns, glw::GLuint n_rows)
{
	static const GLchar* float_lut[4][4] = {
		{ "float", "vec2", "vec3", "vec4" },
		{ 0, "mat2", "mat2x3", "mat2x4" },
		{ 0, "mat3x2", "mat3", "mat3x4" },
		{ 0, "mat4x2", "mat4x3", "mat4" },
	};

	static const GLchar* double_lut[4][4] = {
		{ "double", "dvec2", "dvec3", "dvec4" },
		{ 0, "dmat2", "dmat2x3", "dmat2x4" },
		{ 0, "dmat3x2", "dmat3", "dmat3x4" },
		{ 0, "dmat4x2", "dmat4x3", "dmat4" },
	};

	static const GLchar* int_lut[4] = { "int", "ivec2", "ivec3", "ivec4" };

	static const GLchar* uint_lut[4] = { "uint", "uvec2", "uvec3", "uvec4" };

	const GLchar* result = 0;

	if ((1 > n_columns) || (1 > n_rows) || (4 < n_columns) || (4 < n_rows))
	{
		return 0;
	}

	switch (type)
	{
	case FLOAT:
		result = float_lut[n_columns - 1][n_rows - 1];
		break;
	case DOUBLE:
		result = double_lut[n_columns - 1][n_rows - 1];
		break;
	case INT:
		result = int_lut[n_rows - 1];
		break;
	case UINT:
		result = uint_lut[n_rows - 1];
		break;
	default:
		TCU_FAIL("Invliad enum");
	}

	return result;
}